

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  ostringstream buf;
  ostream local_190;
  
  if (*(int *)((long)this + 0x84) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nin highp vec4 a_pos;\nin highp vec4 a_attr;\nout highp vec4 v_attr;\nvoid main ()\n{\n\tv_attr = a_attr;\n\tgl_Position = a_pos;\n}\n"
               ,(allocator<char> *)&local_190);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,
                  "#version 300 es\nin highp vec4 a_pos;\nin highp vec2 a_attr;\nout mediump vec4 v_out;\n"
                 );
  if (*(int *)((long)this + 0x88) == 1) {
    pcVar1 = "uniform highp sampler2DShadow u_sampler;\n";
LAB_011bf6aa:
    std::operator<<(&local_190,pcVar1);
  }
  else if (*(int *)((long)this + 0x88) == 0) {
    pcVar1 = "uniform highp sampler2D u_sampler;\n";
    goto LAB_011bf6aa;
  }
  std::operator<<(&local_190,"void main ()\n{\n");
  if (*(int *)((long)this + 0x88) == 0) {
    pcVar1 = "\tv_out = vec4(textureLod(u_sampler, a_attr, 0.0).rg, 1.0, 1.0);\n";
  }
  else {
    if (*(int *)((long)this + 0x88) != 1) goto LAB_011bf6ef;
    pcVar1 = 
    "\thighp float a1 = textureLod(u_sampler, vec3(a_attr, 0.0), 0.0);\n\tv_out = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n"
    ;
  }
  std::operator<<(&local_190,pcVar1);
LAB_011bf6ef:
  std::operator<<(&local_190,"\tgl_Position = a_pos;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureCase::genVertexSource (void) const
{
	// vertex shader is passthrough, fragment does the calculations
	if (m_type == TYPE_FRAGMENT)
		return s_attrPassthroughVertexShaderSource;

	// vertex shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"in highp vec4 a_pos;\n"
			"in highp vec2 a_attr;\n"
			"out mediump vec4 v_out;\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"uniform highp sampler2DShadow u_sampler;\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"void main ()\n"
			"{\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"	v_out = vec4(textureLod(u_sampler, a_attr, 0.0).rg, 1.0, 1.0);\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"	highp float a1 = textureLod(u_sampler, vec3(a_attr, 0.0), 0.0);\n"
				"	v_out = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"	gl_Position = a_pos;\n"
			"}\n";
	return buf.str();
}